

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O1

psa_status_t psa_close_key(psa_key_handle_t handle)

{
  ushort uVar1;
  psa_status_t pVar2;
  int iVar3;
  undefined6 in_register_0000003a;
  psa_key_slot_t *ppVar4;
  
  ppVar4 = (psa_key_slot_t *)CONCAT62(in_register_0000003a,handle);
  if ((int)ppVar4 == 0) {
    return 0;
  }
  if ((global_data._1536_1_ & 1) == 0) {
    iVar3 = -0x89;
  }
  else if ((ushort)(handle - 0x21) < 0xffe0) {
    iVar3 = -0x88;
  }
  else {
    ppVar4 = global_data.key_slots + (handle - 1);
    iVar3 = -0x88;
    if (global_data.key_slots[handle - 1].attr.type != 0) {
      iVar3 = 0;
    }
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  uVar1 = (ppVar4->attr).type;
  pVar2 = 0;
  if (uVar1 != 0) {
    if (((uVar1 & 0x7000) != 0x2000) && ((uVar1 & 0x7000) != 0x1000)) {
      if ((uVar1 & 0xcfff) == 0x4001) {
        mbedtls_rsa_free((ppVar4->data).rsa);
      }
      else {
        pVar2 = -0x97;
        if ((uVar1 & 0xcf00) != 0x4100) goto LAB_00127a35;
        mbedtls_ecp_keypair_free((ppVar4->data).ecp);
      }
    }
    free((ppVar4->data).raw.data);
    pVar2 = 0;
  }
LAB_00127a35:
  (ppVar4->data).raw.data = (uint8_t *)0x0;
  (ppVar4->data).raw.bytes = 0;
  (ppVar4->attr).policy.alg = 0;
  (ppVar4->attr).policy.alg2 = 0;
  *(undefined8 *)&(ppVar4->attr).flags = 0;
  (ppVar4->attr).type = 0;
  (ppVar4->attr).bits = 0;
  (ppVar4->attr).lifetime = 0;
  (ppVar4->attr).id = 0;
  (ppVar4->attr).policy.usage = 0;
  return pVar2;
}

Assistant:

psa_status_t psa_close_key( psa_key_handle_t handle )
{
    psa_status_t status;
    psa_key_slot_t *slot;

    if( handle == 0 )
        return( PSA_SUCCESS );

    status = psa_get_key_slot( handle, &slot );
    if( status != PSA_SUCCESS )
        return( status );

    return( psa_wipe_key_slot( slot ) );
}